

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::SetEmailLogging(LogSeverity min_severity,char *addresses)

{
  char *addresses_local;
  LogSeverity min_severity_local;
  
  LogDestination::SetEmailLogging(min_severity,addresses);
  return;
}

Assistant:

void SetEmailLogging(LogSeverity min_severity, const char* addresses) {
  LogDestination::SetEmailLogging(min_severity, addresses);
}